

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

int ZSTD_isRLE(BYTE *src,size_t length)

{
  ulong *puVar1;
  ulong uVar2;
  BYTE *ip;
  BYTE *pBVar3;
  ulong *puVar4;
  BYTE *pStart;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  
  if (length != 1) {
    uVar2 = (ulong)((uint)length & 0x1f);
    if ((length & 0x1f) != 0) {
      puVar4 = (ulong *)(src + 1);
      piVar7 = (int *)src;
      if (uVar2 < 9) {
LAB_001bf3e7:
        puVar1 = (ulong *)(src + uVar2);
        if ((puVar4 < (ulong *)((long)puVar1 - 3U)) && (*piVar7 == (int)*puVar4)) {
          puVar4 = (ulong *)((long)puVar4 + 4);
          piVar7 = piVar7 + 1;
        }
        if ((puVar4 < (ulong *)((long)puVar1 - 1U)) && ((short)*piVar7 == (short)*puVar4)) {
          puVar4 = (ulong *)((long)puVar4 + 2);
          piVar7 = (int *)((long)piVar7 + 2);
        }
        if (puVar4 < puVar1) {
          puVar4 = (ulong *)((long)puVar4 + (ulong)((char)*piVar7 == (char)*puVar4));
        }
        uVar8 = (long)puVar4 - (long)(src + 1);
      }
      else if (*(ulong *)src == *(ulong *)(src + 1)) {
        puVar4 = (ulong *)(src + 9);
        lVar5 = 0;
        do {
          if (src + (uVar2 - 7) <= puVar4) {
            piVar7 = (int *)((long)puVar4 + -1);
            goto LAB_001bf3e7;
          }
          puVar1 = (ulong *)((long)puVar4 + -1);
          uVar8 = *puVar4;
          puVar4 = puVar4 + 1;
          lVar5 = lVar5 + 8;
        } while (*puVar1 == uVar8);
        uVar8 = uVar8 ^ *puVar1;
        uVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        uVar8 = (uVar6 >> 3 & 0x1fffffff) + lVar5;
      }
      else {
        uVar6 = *(ulong *)(src + 1) ^ *(ulong *)src;
        uVar8 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar8 = uVar8 >> 3 & 0x1fffffff;
      }
      if (uVar8 != uVar2 - 1) {
        return 0;
      }
    }
    if (0x1f < length) {
      pBVar3 = src + uVar2;
      do {
        uVar8 = 0xfffffffffffffff8;
        do {
          if (*(long *)(pBVar3 + uVar8 + 8) != (ulong)*src * 0x101010101010101) {
            return 0;
          }
          uVar8 = uVar8 + 8;
        } while (uVar8 < 0x18);
        uVar2 = uVar2 + 0x20;
        pBVar3 = pBVar3 + 0x20;
      } while (uVar2 != length);
    }
  }
  return 1;
}

Assistant:

static int ZSTD_isRLE(const BYTE* src, size_t length) {
    const BYTE* ip = src;
    const BYTE value = ip[0];
    const size_t valueST = (size_t)((U64)value * 0x0101010101010101ULL);
    const size_t unrollSize = sizeof(size_t) * 4;
    const size_t unrollMask = unrollSize - 1;
    const size_t prefixLength = length & unrollMask;
    size_t i;
    if (length == 1) return 1;
    /* Check if prefix is RLE first before using unrolled loop */
    if (prefixLength && ZSTD_count(ip+1, ip, ip+prefixLength) != prefixLength-1) {
        return 0;
    }
    for (i = prefixLength; i != length; i += unrollSize) {
        size_t u;
        for (u = 0; u < unrollSize; u += sizeof(size_t)) {
            if (MEM_readST(ip + i + u) != valueST) {
                return 0;
    }   }   }
    return 1;
}